

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack8to4_int8.h
# Opt level: O2

void ncnn::conv1x1s1_sgemm_pack8to4_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Option *opt)

{
  int iVar1;
  int iVar2;
  Mat bottom_im2col;
  Mat local_70;
  
  iVar1 = bottom_blob->h;
  iVar2 = bottom_blob->w;
  Mat::Mat(&local_70,bottom_blob);
  local_70.h = 1;
  local_70.w = iVar1 * iVar2;
  im2col_sgemm_pack8to4_int8_sse(&local_70,top_blob,kernel,opt);
  Mat::~Mat(&local_70);
  return;
}

Assistant:

static void conv1x1s1_sgemm_pack8to4_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    const int size = w * h;

    Mat bottom_im2col = bottom_blob;
    bottom_im2col.w = size;
    bottom_im2col.h = 1;

    im2col_sgemm_pack8to4_int8_sse(bottom_im2col, top_blob, kernel, opt);
}